

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O2

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
::check(GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
        *this,Node *node,
       vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
       *visitedStack,Context *errorContext)

{
  Source *pSVar1;
  __normal_iterator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_**,_std::vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>_>
  _Var2;
  long lVar3;
  Source *source;
  pointer pNVar4;
  ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
  stack;
  Node *local_20;
  
  local_20 = (Node *)this;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const**,std::vector<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*const>>
                    (node->processor,(node->sources).items);
  pSVar1 = (node->sources).items;
  if ((Source *)_Var2._M_current != pSVar1) {
    stack.e = (Node **)visitedStack;
    stack.s = &pSVar1->node;
    throwCycleError((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
                     *)node->processor,stack,errorContext);
  }
  local_20 = (Node *)this;
  std::
  vector<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*>>
  ::
  emplace_back<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*>
            ((vector<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node_const*>>
              *)node,&local_20);
  pNVar4 = (this->nodes).
           super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar3 = (long)(this->nodes).
                     super__Vector_base<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage << 4; lVar3 != 0;
      lVar3 = lVar3 + -0x10) {
    check((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
           *)pNVar4->processor,node,
          (vector<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*,_std::allocator<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>_>
           *)((pNVar4->sources).items + 1),errorContext);
    pNVar4 = (pointer)&(pNVar4->sources).numActive;
  }
  (node->sources).items = (Source *)&(node->sources).items[-1].connection;
  return;
}

Assistant:

static void check (const Node& node, std::vector<const Node*>& visitedStack, const ContextType& errorContext)
        {
            if (std::find (visitedStack.begin(), visitedStack.end(), std::addressof (node)) != visitedStack.end())
                throwCycleError (visitedStack, errorContext);

            visitedStack.push_back (std::addressof (node));

            for (auto& source : node.sources)
                check (source.node, visitedStack, Subclass::getContext (source.connection));

            visitedStack.pop_back();
        }